

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFilteringTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::TextureCubeFilteringCase::deinit(TextureCubeFilteringCase *this)

{
  TextureCube *this_00;
  bool bVar1;
  reference ppTVar2;
  __normal_iterator<glu::TextureCube_**,_std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>_>
  local_20;
  __normal_iterator<glu::TextureCube_**,_std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>_>
  local_18;
  iterator i;
  TextureCubeFilteringCase *this_local;
  
  i._M_current = (TextureCube **)this;
  local_18._M_current =
       (TextureCube **)
       std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::begin
                 (&this->m_textures);
  while( true ) {
    local_20._M_current =
         (TextureCube **)
         std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::end
                   (&this->m_textures);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<glu::TextureCube_**,_std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppTVar2;
    if (this_00 != (TextureCube *)0x0) {
      glu::TextureCube::~TextureCube(this_00);
      operator_delete(this_00,0x180);
    }
    __gnu_cxx::
    __normal_iterator<glu::TextureCube_**,_std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>_>
    ::operator++(&local_18,0);
  }
  std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::clear(&this->m_textures);
  deqp::gls::TextureTestUtil::TextureRenderer::clear(&this->m_renderer);
  std::
  vector<deqp::gles2::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::TextureCubeFilteringCase::FilterCase>_>
  ::clear(&this->m_cases);
  return;
}

Assistant:

void TextureCubeFilteringCase::deinit (void)
{
	for (std::vector<glu::TextureCube*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
		delete *i;
	m_textures.clear();

	m_renderer.clear();
	m_cases.clear();
}